

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem-disk-unix.c++
# Opt level: O2

void __thiscall kj::anon_unknown_8::DiskHandle::datasync(DiskHandle *this)

{
  int iVar1;
  Fault f;
  Fault local_10;
  
  do {
    iVar1 = fdatasync((this->fd).fd);
    if (-1 < iVar1) {
      return;
    }
    iVar1 = kj::_::Debug::getOsErrorNumber(false);
  } while (iVar1 == -1);
  if (iVar1 == 0) {
    return;
  }
  kj::_::Debug::Fault::Fault
            (&local_10,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
             ,0x144,iVar1,"fdatasync(fd)","");
  kj::_::Debug::Fault::fatal(&local_10);
}

Assistant:

void datasync() const {
    // The presence of the _POSIX_SYNCHRONIZED_IO define is supposed to tell us that fdatasync()
    // exists. But Apple defines this yet doesn't offer fdatasync(). Thanks, Apple.
#if _POSIX_SYNCHRONIZED_IO && !__APPLE__
    KJ_SYSCALL(fdatasync(fd));
#else
    this->sync();
#endif
  }